

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qmainwindowlayout.cpp
# Opt level: O3

void __thiscall QMainWindowLayout::setDocumentMode(QMainWindowLayout *this,bool enabled)

{
  ulong uVar1;
  long lVar2;
  long lVar3;
  long lVar4;
  ulong uVar5;
  
  if (this[0x710] == (QMainWindowLayout)enabled) {
    return;
  }
  this[0x710] = (QMainWindowLayout)enabled;
  lVar4 = *(long *)(this + 0x718);
  if (lVar4 == 0) {
    lVar4 = 0;
    uVar5 = 0;
LAB_00432ead:
    if (lVar4 == 0 && uVar5 == 0) goto LAB_00432f2e;
  }
  else {
    if (**(char **)(lVar4 + 0x20) == -1) {
      uVar1 = 1;
      do {
        uVar5 = uVar1;
        if (*(ulong *)(lVar4 + 0x10) == uVar5) {
          lVar4 = 0;
          uVar5 = 0;
          break;
        }
        uVar1 = uVar5 + 1;
      } while ((*(char **)(lVar4 + 0x20))[(ulong)((uint)uVar5 & 0x7f) + (uVar5 >> 7) * 0x90] == -1);
      goto LAB_00432ead;
    }
    uVar5 = 0;
  }
  do {
    lVar2 = (uVar5 >> 7) * 0x90;
    QTabBar::setDocumentMode
              (*(QTabBar **)
                (*(long *)(*(long *)(lVar4 + 0x20) + 0x80 + lVar2) +
                (ulong)*(byte *)((ulong)((uint)uVar5 & 0x7f) + *(long *)(lVar4 + 0x20) + lVar2) * 8)
               ,(bool)this[0x710]);
    do {
      if (*(long *)(lVar4 + 0x10) - 1U == uVar5) {
        lVar4 = 0;
        uVar5 = 0;
        break;
      }
      uVar5 = uVar5 + 1;
    } while (*(char *)((ulong)((uint)uVar5 & 0x7f) + (uVar5 >> 7) * 0x90 + *(long *)(lVar4 + 0x20))
             == -1);
  } while ((lVar4 != 0) || (uVar5 != 0));
LAB_00432f2e:
  lVar4 = *(long *)(this + 0x730);
  if (lVar4 != 0) {
    lVar2 = *(long *)(this + 0x728);
    lVar3 = 0;
    do {
      QTabBar::setDocumentMode(*(QTabBar **)(lVar2 + lVar3),(bool)this[0x710]);
      lVar3 = lVar3 + 8;
    } while (lVar4 << 3 != lVar3);
  }
  return;
}

Assistant:

void QMainWindowLayout::setDocumentMode(bool enabled)
{
    if (_documentMode == enabled)
        return;

    _documentMode = enabled;

    // Update the document mode for all tab bars
    for (QTabBar *bar : std::as_const(usedTabBars))
        bar->setDocumentMode(_documentMode);
    for (QTabBar *bar : std::as_const(unusedTabBars))
        bar->setDocumentMode(_documentMode);
}